

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<Fad<double>_>::Subst_LForward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  TPZBaseMatrix *pTVar1;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *x;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar2;
  long lVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  char *in_stack_000000c8;
  char *in_stack_000000d0;
  int64_t i;
  Fad<double> sum;
  int64_t c;
  int64_t r;
  Fad<double> *in_stack_fffffffffffffed0;
  Fad<double> *in_stack_fffffffffffffed8;
  Fad<double> *pFVar5;
  Fad<double> *in_stack_ffffffffffffff00;
  Fad<double> *in_stack_ffffffffffffff08;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *in_stack_ffffffffffffff18;
  Fad<double> *in_stack_ffffffffffffff20;
  undefined1 local_d0 [32];
  undefined1 local_b0 [48];
  undefined1 local_80 [48];
  long local_50;
  undefined8 local_48;
  Fad<double> *local_20;
  Fad<double> *local_18;
  TPZBaseMatrix *local_10;
  
  local_10 = in_RSI;
  x = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)TPZBaseMatrix::Rows(in_RSI);
  pFVar2 = (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)(**(code **)(*in_RDI + 0x60))();
  if (((x != pFVar2) || ((char)in_RDI[3] == '\0')) || ((char)in_RDI[3] != '\x04')) {
    Error(in_stack_000000d0,in_stack_000000c8);
  }
  local_18 = (Fad<double> *)0x0;
  while( true ) {
    pFVar5 = local_18;
    lVar3 = (**(code **)(*in_RDI + 0x60))();
    if (lVar3 <= (long)pFVar5) break;
    local_20 = (Fad<double> *)0x0;
    while( true ) {
      pFVar5 = local_20;
      iVar4 = TPZBaseMatrix::Cols(local_10);
      if (iVar4 <= (long)pFVar5) break;
      local_48 = 0;
      Fad<double>::Fad<double,_nullptr>(pFVar5,&in_stack_fffffffffffffed8->val_);
      for (local_50 = 0; pTVar1 = local_10, local_50 < (long)local_18; local_50 = local_50 + 1) {
        (**(code **)(*in_RDI + 0x120))(local_80,in_RDI,local_18,local_50);
        (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(local_b0,local_10,local_50,local_20);
        operator*<Fad<double>,_Fad<double>,_nullptr>
                  (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        Fad<double>::operator+=(in_stack_ffffffffffffff00,x);
        FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                  ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffed0);
        Fad<double>::~Fad(in_stack_fffffffffffffed0);
        Fad<double>::~Fad(in_stack_fffffffffffffed0);
      }
      in_stack_fffffffffffffed0 = local_18;
      in_stack_fffffffffffffed8 = local_20;
      (*(local_10->super_TPZSavable)._vptr_TPZSavable[0x24])(&stack0xffffffffffffff00);
      operator-<Fad<double>,_Fad<double>,_nullptr>
                (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      Fad<double>::Fad<FadBinaryMinus<Fad<double>,Fad<double>>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0x23])
                (pTVar1,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,local_d0);
      Fad<double>::~Fad(in_stack_fffffffffffffed0);
      FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>::~FadExpr
                ((FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffed0);
      Fad<double>::~Fad(in_stack_fffffffffffffed0);
      Fad<double>::~Fad(in_stack_fffffffffffffed0);
      local_20 = (Fad<double> *)((long)&local_20->val_ + 1);
    }
    local_18 = (Fad<double> *)((long)&local_18->val_ + 1);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Subst_LForward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ELDLt) {
		Error("TPZMatrix::Subst_LForward incompatible dimensions\n");
	}
    for ( int64_t r = 0; r < Dim(); r++ ) {
        for ( int64_t c = 0; c < B->Cols();  c++ )    {
            // Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
            //
            TVar sum = 0.0;
            for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, B->GetVal(r, c) - sum );
        }
    }
    return( 1 );
}